

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int send_certificate_and_certificate_verify
              (ptls_t *tls,ptls_message_emitter_t *emitter,
              st_ptls_signature_algorithms_t *signature_algorithms,ptls_iovec_t context,
              char *context_string,int push_status_request)

{
  ptls_buffer_t *ppVar1;
  st_ptls_sign_certificate_t *psVar2;
  int iVar3;
  ptls_private_key_result_t pVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ptls_context_t *ppVar8;
  byte bVar9;
  uint8_t *msg;
  ptls_emit_certificate_t *ppVar10;
  ptls_key_schedule_t *sched;
  size_t sVar11;
  ptls_iovec_t pVar12;
  ptls_iovec_t pVar13;
  uint16_t algo_1;
  uint16_t algo;
  ptls_key_schedule_t *local_240;
  undefined1 local_232;
  undefined1 local_231;
  ptls_buffer_t *local_230;
  size_t local_228;
  size_t local_220;
  undefined2 local_214;
  undefined2 local_212;
  size_t local_210;
  uint8_t data [226];
  uint8_t handshake_data [226];
  
  ppVar8 = tls->ctx;
  ppVar10 = &send_certificate_and_certificate_verify::default_emit_certificate;
  if (ppVar8->emit_certificate != (ptls_emit_certificate_t *)0x0) {
    ppVar10 = ppVar8->emit_certificate;
  }
  if ((tls->field_0x160 & 0x20) == 0) {
    if (signature_algorithms->count == 0) {
      return 0x6d;
    }
    iVar3 = (*ppVar10->cb)(ppVar10,tls,emitter,tls->key_schedule,context,push_status_request);
    if (iVar3 != 0) {
      return iVar3;
    }
    ppVar8 = tls->ctx;
    if (ppVar8->sign_certificate == (ptls_sign_certificate_t *)0x0) {
      return 0;
    }
    if ((ppVar8->private_key_method != (ptls_private_key_method_t *)0x0) &&
       (bVar9 = tls->field_0x160, (bVar9 & 1) != 0)) {
      if ((bVar9 & 0x20) == 0) {
        (tls->handshake_buf).base = "";
        (tls->handshake_buf).capacity = 0;
        (tls->handshake_buf).off = 0;
        (tls->handshake_buf).is_allocated = 0;
        sVar11 = build_certificate_verify_signdata(handshake_data,tls->key_schedule,context_string);
        bVar9 = tls->field_0x160;
        ppVar8 = tls->ctx;
      }
      else {
        sVar11 = 0;
      }
      if ((bVar9 & 0x20) != 0) goto LAB_00117fae;
      pVar13.len = sVar11;
      pVar13.base = handshake_data;
      pVar4 = (*ppVar8->private_key_method->sign)
                        (ppVar8->sign_certificate,tls,&algo_1,&tls->handshake_buf,pVar13,
                         signature_algorithms->list,signature_algorithms->count);
      goto LAB_00117fcb;
    }
    iVar3 = (*emitter->begin_message)(emitter);
    if (iVar3 != 0) {
      return iVar3;
    }
    ppVar1 = emitter->buf;
    local_240 = tls->key_schedule;
    sVar11 = ppVar1->off;
    local_232 = 0xf;
    iVar3 = ptls_buffer__do_pushv(ppVar1,&local_232,1);
    if (iVar3 != 0) {
      return iVar3;
    }
    local_228 = sVar11;
    iVar3 = ptls_buffer__do_pushv(ppVar1,"",3);
    if (iVar3 != 0) {
      return iVar3;
    }
    sVar11 = ppVar1->off;
    local_230 = emitter->buf;
    local_220 = local_230->off;
    local_214 = 0;
    iVar3 = ptls_buffer__do_pushv(local_230,&local_214,2);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = ptls_buffer__do_pushv(local_230,"",2);
    if (iVar3 != 0) {
      return iVar3;
    }
    local_210 = local_230->off;
    sVar5 = build_certificate_verify_signdata(data,tls->key_schedule,context_string);
    psVar2 = tls->ctx->sign_certificate;
    pVar12.len = sVar5;
    pVar12.base = data;
    iVar3 = (*psVar2->cb)(psVar2,tls,&algo,local_230,pVar12,signature_algorithms->list,
                          signature_algorithms->count);
    if (iVar3 != 0) {
      return iVar3;
    }
    local_230->base[local_220] = algo._1_1_;
    local_230->base[local_220 + 1] = (uint8_t)algo;
    lVar7 = local_230->off - local_210;
    local_230->base[local_210 - 2] = (uint8_t)((ulong)lVar7 >> 8);
    local_230->base[local_210 - 1] = (uint8_t)lVar7;
    uVar6 = ppVar1->off - sVar11;
    for (lVar7 = 0x10; lVar7 != -8; lVar7 = lVar7 + -8) {
      ppVar1->base[sVar11 - 3] = (uint8_t)(uVar6 >> ((byte)lVar7 & 0x3f));
      sVar11 = sVar11 + 1;
    }
    if (local_240 == (ptls_key_schedule_t *)0x0) goto LAB_001181b9;
    msg = ppVar1->base + local_228;
    sVar11 = ppVar1->off - local_228;
    sched = local_240;
  }
  else {
LAB_00117fae:
    pVar4 = (*ppVar8->private_key_method->complete)
                      (ppVar8->sign_certificate,tls,&algo_1,&tls->handshake_buf);
LAB_00117fcb:
    if (pVar4 == ptls_private_key_failure) {
      tls->field_0x160 = tls->field_0x160 & 0xdf;
      return 0x209;
    }
    if (pVar4 == ptls_private_key_retry) {
      tls->field_0x160 = tls->field_0x160 | 0x20;
      return 0x202;
    }
    if (pVar4 != ptls_private_key_success) {
      return 0;
    }
    tls->field_0x160 = tls->field_0x160 & 0xdf;
    iVar3 = (*emitter->begin_message)(emitter);
    if (iVar3 != 0) {
      return iVar3;
    }
    ppVar1 = emitter->buf;
    sched = tls->key_schedule;
    sVar11 = ppVar1->off;
    local_231 = 0xf;
    iVar3 = ptls_buffer__do_pushv(ppVar1,&local_231,1);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = ptls_buffer__do_pushv(ppVar1,"",3);
    if (iVar3 != 0) {
      return iVar3;
    }
    sVar5 = ppVar1->off;
    local_240 = (ptls_key_schedule_t *)emitter->buf;
    local_230 = *(ptls_buffer_t **)local_240->secret;
    local_228 = (tls->handshake_buf).off;
    local_212 = 0;
    iVar3 = ptls_buffer__do_pushv((ptls_buffer_t *)local_240,&local_212,2);
    if (iVar3 != 0) {
      return iVar3;
    }
    iVar3 = ptls_buffer__do_pushv((ptls_buffer_t *)local_240,"",2);
    if (iVar3 != 0) {
      return iVar3;
    }
    local_220 = *(size_t *)local_240->secret;
    iVar3 = ptls_buffer_reserve((ptls_buffer_t *)local_240,local_228);
    if (iVar3 != 0) {
      return iVar3;
    }
    memcpy((void *)(*(long *)local_240 + *(long *)local_240->secret),(tls->handshake_buf).base,
           local_228);
    *(size_t *)local_240->secret = *(long *)local_240->secret + local_228;
    ptls_buffer_dispose(&tls->handshake_buf);
    *(undefined1 *)((long)&local_230->base + *(long *)local_240) = algo_1._1_1_;
    *(undefined1 *)((long)&local_230->base + *(long *)local_240 + 1) = (undefined1)algo_1;
    lVar7 = *(long *)local_240->secret - local_220;
    *(char *)(*(long *)local_240 + -2 + local_220) = (char)((ulong)lVar7 >> 8);
    *(char *)(*(long *)local_240 + -1 + local_220) = (char)lVar7;
    uVar6 = ppVar1->off - sVar5;
    for (lVar7 = 0x10; lVar7 != -8; lVar7 = lVar7 + -8) {
      ppVar1->base[sVar5 - 3] = (uint8_t)(uVar6 >> ((byte)lVar7 & 0x3f));
      sVar5 = sVar5 + 1;
    }
    if (sched == (ptls_key_schedule_t *)0x0) goto LAB_001181b9;
    msg = ppVar1->base + sVar11;
    sVar11 = ppVar1->off - sVar11;
  }
  ptls__key_schedule_update_hash(sched,msg,sVar11);
LAB_001181b9:
  iVar3 = (*emitter->commit_message)(emitter);
  return iVar3;
}

Assistant:

static int send_certificate_and_certificate_verify(ptls_t *tls, ptls_message_emitter_t *emitter,
                                                   struct st_ptls_signature_algorithms_t *signature_algorithms,
                                                   ptls_iovec_t context, const char *context_string, int push_status_request)
{
    static ptls_emit_certificate_t default_emit_certificate = {default_emit_certificate_cb};
    ptls_emit_certificate_t *emit_certificate =
        tls->ctx->emit_certificate != NULL ? tls->ctx->emit_certificate : &default_emit_certificate;
    int ret;

    msg("send_certificate_and_certificate_verify");
    if (tls->in_handshake)
        goto resume_handshake;

    if (signature_algorithms->count == 0) {
        ret = PTLS_ALERT_MISSING_EXTENSION;
        goto Exit;
    }

    /* send Certificate (or the equivalent) */
    if ((ret = emit_certificate->cb(emit_certificate, tls, emitter, tls->key_schedule, context, push_status_request)) != 0)
        goto Exit;

    /* build and send CertificateVerify */
    if (tls->ctx->sign_certificate != NULL) {
        if ((tls->ctx->private_key_method) && (tls->is_server))
        {
            uint8_t  handshake_data[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
            size_t   handshake_len = 0;
            if (!tls->in_handshake)
            {
                ptls_buffer_init(&tls->handshake_buf, "", 0);
                handshake_len = build_certificate_verify_signdata(handshake_data, tls->key_schedule, context_string);
            }
            enum ptls_private_key_result_t res;
            uint16_t algo;
            if (!tls->in_handshake)
            {
                res = tls->ctx->private_key_method->sign(tls->ctx->sign_certificate,
                                                         tls, &algo, &tls->handshake_buf,
                                                         ptls_iovec_init(handshake_data, handshake_len),
                                                         signature_algorithms->list,
                                                         signature_algorithms->count);
            }
            else
resume_handshake:
                res = tls->ctx->private_key_method->complete(tls->ctx->sign_certificate,
                                                             tls, &algo, &tls->handshake_buf);
            switch (res)
            {
                case ptls_private_key_success:
                    msg("Completed private_key_method");
                    ret = 0;
                    tls->in_handshake = 0;

                    ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY,
                    {
                        ptls_buffer_t *sendbuf = emitter->buf;
                        size_t algo_off = sendbuf->off;
                        size_t siglen = tls->handshake_buf.off;
                        msg("signature len: %ld", siglen);
                        ptls_buffer_push16(sendbuf, 0); /* filled in later */
                        ptls_buffer_push_block(sendbuf, 2,
                        {
                            if ((ret = ptls_buffer_reserve(sendbuf, siglen)) != 0)
                            {
                                msg("Error reserving data space in signature");
                                goto Exit;
                            }
                            memcpy(sendbuf->base + sendbuf->off, tls->handshake_buf.base, siglen);
                            sendbuf->off += siglen;
                            ptls_buffer_dispose(&tls->handshake_buf);
                            sendbuf->base[algo_off] = (uint8_t)(algo >> 8);
                            sendbuf->base[algo_off + 1] = (uint8_t)algo;
                        });
                    });
                    break;
                case ptls_private_key_retry:
                    msg("Retry private_key_method");
                    ret = PTLS_ERROR_IN_PROGRESS;
                    tls->in_handshake = 1;
                    goto Exit;
                case ptls_private_key_failure:
                    msg("FAILED private_key_method");
                    ret = PTLS_ERROR_SIGN_FAILURE;
                    tls->in_handshake = 0;
                    goto Exit;
            }
        }
        else
            ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY, {
                ptls_buffer_t *sendbuf = emitter->buf;
                size_t algo_off = sendbuf->off;
                ptls_buffer_push16(sendbuf, 0); /* filled in later */
                ptls_buffer_push_block(sendbuf, 2, {
                    uint16_t algo;
                    uint8_t data[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
                    size_t datalen = build_certificate_verify_signdata(data, tls->key_schedule, context_string);
                    if ((ret = tls->ctx->sign_certificate->cb(tls->ctx->sign_certificate, tls, &algo, sendbuf,
                                                              ptls_iovec_init(data, datalen), signature_algorithms->list,
                                                              signature_algorithms->count)) != 0) {
                        goto Exit;
                    }
                    sendbuf->base[algo_off] = (uint8_t)(algo >> 8);
                    sendbuf->base[algo_off + 1] = (uint8_t)algo;
                });
            });
    }

Exit:
    return ret;
}